

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O3

void __thiscall chrono::ChBodyAuxRef::ArchiveIN(ChBodyAuxRef *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChBodyAuxRef *)
            ((long)&this[-1].auxref_to_abs.super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x40),in_RSI);
  return;
}

Assistant:

void ChBodyAuxRef::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBodyAuxRef>();

    // deserialize parent class
    ChBody::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(auxref_to_cog);
    marchive >> CHNVP(auxref_to_abs);
}